

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

block * __thiscall storage::get(block *__return_storage_ptr__,storage *this,bool *ok,uint64_t idx)

{
  bool bVar1;
  block local_120;
  block local_b0;
  undefined1 local_29;
  uint64_t local_28;
  uint64_t idx_local;
  bool *ok_local;
  storage *this_local;
  block *b;
  
  local_29 = 0;
  __return_storage_ptr__->idx = 0;
  __return_storage_ptr__->timestamp = 0;
  local_28 = idx;
  idx_local = (uint64_t)ok;
  ok_local = (bool *)this;
  this_local = (storage *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->prevsha256);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->data);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->sha256);
  bVar1 = empty(this);
  if (bVar1) {
    *(undefined1 *)idx_local = 0;
  }
  else {
    first(&local_b0,this);
    block::operator=(__return_storage_ptr__,&local_b0);
    block::~block(&local_b0);
    while (__return_storage_ptr__->idx != local_28) {
      bVar1 = at_end(this);
      if (bVar1) {
        *(undefined1 *)idx_local = 0;
        return __return_storage_ptr__;
      }
      next(&local_120,this);
      block::operator=(__return_storage_ptr__,&local_120);
      block::~block(&local_120);
    }
    *(undefined1 *)idx_local = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

block get(bool *ok, std::uint64_t idx) {
        block b{};
        if ( empty() ) {
            *ok = false;
            return b;
        }

        for ( b = first(); ; b = next() ) {
            if ( b.idx == idx ) {
                *ok = true;
                return b;
            }

            if ( at_end() ) {
                break;
            }
        }

        *ok = false;

        return b;
    }